

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O1

int main(void)

{
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return 0;
}

Assistant:

int main(){

    concurrent_writer_iterator_test();
    in_memory_snapshot_cleanup_test();
    drop_kv_on_snap_iterator_test();
    rollback_secondary_kvs();
    multi_version_test();
#ifdef __CRC32
    crash_recovery_test(true);
    crash_recovery_test(false);
#endif
    snapshot_test();
    in_memory_snapshot_rollback_test();
    in_memory_snapshot_test();
    in_memory_snapshot_on_dirty_hbtrie_test();
    in_memory_snapshot_compaction_test();
    snapshot_clone_test();
    snapshot_parallel_clone_test();
    snapshot_stats_test();
    snapshot_with_uncomitted_data_test();
    snapshot_markers_in_file_test(true); // multi kv instance mode
    snapshot_markers_in_file_test(false); // single kv instance mode
    snapshot_with_deletes_test();
    snapshot_without_seqtree(true); // multi kv instance mode
    snapshot_without_seqtree(false); // single kv instance mode
    rollback_during_ops_test(NULL);
    rollback_forward_seqnum();
    rollback_test(false); // single kv instance mode
    rollback_test(true); // multi kv instance mode
    rollback_and_snapshot_test();
    rollback_ncommits();
    transaction_test();
    transaction_simple_api_test();
    transaction_in_memory_snapshot_test();
    rollback_prior_to_ops(true); // wal commit
    rollback_prior_to_ops(false); // normal commit
    snapshot_concurrent_compaction_test();
    rollback_to_zero_test(true); // multi kv instance mode
    rollback_to_zero_test(false); // single kv instance mode
    rollback_to_zero_after_compact_test(false); // single kv instance mode
    rollback_to_zero_after_compact_test(true); // multi kv instance mode
    rollback_all_test(true); // multi kv instance mode
    rollback_all_test(false); // single kv instance mode
    rollback_to_wal_test(true); // multi kv instance mode
    rollback_to_wal_test(false); // single kv instance mode
    rollback_drop_multi_files_kvs_test();
    rollback_without_seqtree(true); // multi kv instance mode
    rollback_without_seqtree(false); // single kv instance mode
    tx_crash_recover_test();
    auto_compaction_snapshots_test(); // test snapshots with auto-compaction

    return 0;
}